

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_get_rsassa_pss_params
              (mbedtls_x509_buf *params,mbedtls_md_type_t *md_alg,mbedtls_md_type_t *mgf_md,
              int *salt_len)

{
  int iVar1;
  uchar *end_00;
  uchar *puVar2;
  bool bVar3;
  int local_8c;
  undefined1 local_88 [4];
  int trailer_field;
  mbedtls_x509_buf alg_params;
  mbedtls_x509_buf alg_id;
  size_t len;
  uchar *end2;
  uchar *end;
  uchar *p;
  int *piStack_30;
  int ret;
  int *salt_len_local;
  mbedtls_md_type_t *mgf_md_local;
  mbedtls_md_type_t *md_alg_local;
  mbedtls_x509_buf *params_local;
  
  *md_alg = MBEDTLS_MD_SHA1;
  *mgf_md = MBEDTLS_MD_SHA1;
  *salt_len = 0x14;
  if (params->tag == 0x30) {
    end = params->p;
    end_00 = end + params->len;
    if (end == end_00) {
      params_local._4_4_ = 0;
    }
    else {
      piStack_30 = salt_len;
      salt_len_local = (int *)mgf_md;
      mgf_md_local = md_alg;
      md_alg_local = (mbedtls_md_type_t *)params;
      p._4_4_ = mbedtls_asn1_get_tag(&end,end_00,(size_t *)&alg_id.p,0xa0);
      if (p._4_4_ == 0) {
        puVar2 = end + (long)alg_id.p;
        p._4_4_ = mbedtls_x509_get_alg_null(&end,puVar2,(mbedtls_x509_buf *)&alg_params.p);
        if (p._4_4_ != 0) {
          return p._4_4_;
        }
        iVar1 = mbedtls_oid_get_md_alg((mbedtls_asn1_buf *)&alg_params.p,mgf_md_local);
        if (iVar1 != 0) {
          return iVar1 + -0x2300;
        }
        if (end != puVar2) {
          return -0x2366;
        }
        p._4_4_ = 0;
      }
      else {
        if (p._4_4_ != -0x62) {
          return p._4_4_ + -0x2300;
        }
        p._4_4_ = 0xffffff9e;
      }
      if (end == end_00) {
        params_local._4_4_ = 0;
      }
      else {
        p._4_4_ = mbedtls_asn1_get_tag(&end,end_00,(size_t *)&alg_id.p,0xa1);
        if (p._4_4_ == 0) {
          puVar2 = end + (long)alg_id.p;
          p._4_4_ = mbedtls_x509_get_alg
                              (&end,puVar2,(mbedtls_x509_buf *)&alg_params.p,
                               (mbedtls_x509_buf *)local_88);
          if (p._4_4_ != 0) {
            return p._4_4_;
          }
          bVar3 = true;
          if (alg_id._0_8_ == 9) {
            iVar1 = memcmp(anon_var_dwarf_1372,(void *)alg_id.len,9);
            bVar3 = iVar1 != 0;
          }
          if (bVar3) {
            return -0x20ae;
          }
          iVar1 = x509_get_hash_alg((mbedtls_x509_buf *)local_88,(mbedtls_md_type_t *)salt_len_local
                                   );
          if (iVar1 != 0) {
            return iVar1;
          }
          if (end != puVar2) {
            return -0x2366;
          }
          p._4_4_ = 0;
        }
        else {
          if (p._4_4_ != -0x62) {
            return p._4_4_ + -0x2300;
          }
          p._4_4_ = 0xffffff9e;
        }
        if (end == end_00) {
          params_local._4_4_ = 0;
        }
        else {
          p._4_4_ = mbedtls_asn1_get_tag(&end,end_00,(size_t *)&alg_id.p,0xa2);
          if (p._4_4_ == 0) {
            puVar2 = end + (long)alg_id.p;
            iVar1 = mbedtls_asn1_get_int(&end,puVar2,piStack_30);
            if (iVar1 != 0) {
              return iVar1 + -0x2300;
            }
            if (end != puVar2) {
              return -0x2366;
            }
            p._4_4_ = 0;
          }
          else {
            if (p._4_4_ != -0x62) {
              return p._4_4_ + -0x2300;
            }
            p._4_4_ = 0xffffff9e;
          }
          if (end == end_00) {
            params_local._4_4_ = 0;
          }
          else {
            p._4_4_ = mbedtls_asn1_get_tag(&end,end_00,(size_t *)&alg_id.p,0xa3);
            if (p._4_4_ == 0) {
              puVar2 = end + (long)alg_id.p;
              iVar1 = mbedtls_asn1_get_int(&end,puVar2,&local_8c);
              if (iVar1 != 0) {
                return iVar1 + -0x2300;
              }
              if (end != puVar2) {
                return -0x2366;
              }
              if (local_8c != 1) {
                return -0x2300;
              }
            }
            else if (p._4_4_ != -0x62) {
              return p._4_4_ + -0x2300;
            }
            if (end == end_00) {
              params_local._4_4_ = 0;
            }
            else {
              params_local._4_4_ = -0x2366;
            }
          }
        }
      }
    }
  }
  else {
    params_local._4_4_ = -0x2362;
  }
  return params_local._4_4_;
}

Assistant:

int mbedtls_x509_get_rsassa_pss_params( const mbedtls_x509_buf *params,
                                mbedtls_md_type_t *md_alg, mbedtls_md_type_t *mgf_md,
                                int *salt_len )
{
    int ret;
    unsigned char *p;
    const unsigned char *end, *end2;
    size_t len;
    mbedtls_x509_buf alg_id, alg_params;

    /* First set everything to defaults */
    *md_alg = MBEDTLS_MD_SHA1;
    *mgf_md = MBEDTLS_MD_SHA1;
    *salt_len = 20;

    /* Make sure params is a SEQUENCE and setup bounds */
    if( params->tag != ( MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) )
        return( MBEDTLS_ERR_X509_INVALID_ALG +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

    p = (unsigned char *) params->p;
    end = p + params->len;

    if( p == end )
        return( 0 );

    /*
     * HashAlgorithm
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                    MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 0 ) ) == 0 )
    {
        end2 = p + len;

        /* HashAlgorithm ::= AlgorithmIdentifier (without parameters) */
        if( ( ret = mbedtls_x509_get_alg_null( &p, end2, &alg_id ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_oid_get_md_alg( &alg_id, md_alg ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

        if( p != end2 )
            return( MBEDTLS_ERR_X509_INVALID_ALG +
                    MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }
    else if( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

    if( p == end )
        return( 0 );

    /*
     * MaskGenAlgorithm
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                    MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 1 ) ) == 0 )
    {
        end2 = p + len;

        /* MaskGenAlgorithm ::= AlgorithmIdentifier (params = HashAlgorithm) */
        if( ( ret = mbedtls_x509_get_alg( &p, end2, &alg_id, &alg_params ) ) != 0 )
            return( ret );

        /* Only MFG1 is recognised for now */
        if( MBEDTLS_OID_CMP( MBEDTLS_OID_MGF1, &alg_id ) != 0 )
            return( MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE +
                    MBEDTLS_ERR_OID_NOT_FOUND );

        /* Parse HashAlgorithm */
        if( ( ret = x509_get_hash_alg( &alg_params, mgf_md ) ) != 0 )
            return( ret );

        if( p != end2 )
            return( MBEDTLS_ERR_X509_INVALID_ALG +
                    MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }
    else if( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

    if( p == end )
        return( 0 );

    /*
     * salt_len
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                    MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 2 ) ) == 0 )
    {
        end2 = p + len;

        if( ( ret = mbedtls_asn1_get_int( &p, end2, salt_len ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

        if( p != end2 )
            return( MBEDTLS_ERR_X509_INVALID_ALG +
                    MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }
    else if( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

    if( p == end )
        return( 0 );

    /*
     * trailer_field (if present, must be 1)
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                    MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 3 ) ) == 0 )
    {
        int trailer_field;

        end2 = p + len;

        if( ( ret = mbedtls_asn1_get_int( &p, end2, &trailer_field ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

        if( p != end2 )
            return( MBEDTLS_ERR_X509_INVALID_ALG +
                    MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

        if( trailer_field != 1 )
            return( MBEDTLS_ERR_X509_INVALID_ALG );
    }
    else if( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

    if( p != end )
        return( MBEDTLS_ERR_X509_INVALID_ALG +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}